

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

void __thiscall CClient::ProcessServerPacket(CClient *this,CNetChunk *pPacket)

{
  CUnpacker *pCVar1;
  CPacker *pCVar2;
  CSnapshot *pSnapshot;
  CSnapshotStorage CVar3;
  char cVar4;
  void *pvVar5;
  IGameClient *pIVar6;
  _func_int *p_Var7;
  IMapChecker *pIVar8;
  IOHANDLE pIVar9;
  IStorage *pIVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  undefined1 *puVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  char *pcVar25;
  SHA256_DIGEST *pSVar26;
  uchar *puVar27;
  char *pcVar28;
  undefined4 extraout_var;
  SHA256_DIGEST *pSVar29;
  _func_int **pp_Var30;
  int64 iVar31;
  undefined4 extraout_var_00;
  CData *pDst_;
  long lVar32;
  int64 iVar33;
  int64 iVar34;
  int64 iVar35;
  undefined1 *puVar36;
  uint uVar37;
  char *pcVar38;
  undefined8 uVar39;
  CClient *this_00;
  IConsole *pIVar40;
  int in_R9D;
  long in_FS_OFFSET;
  undefined1 auVar41 [16];
  CSnapshot *pDeltaShot;
  CUnpacker Unpacker;
  char aBuf_2 [256];
  char aBuf [256];
  CMsgPacker Msg;
  
  puVar19 = &stack0xffffffffffffffd0;
  do {
    puVar36 = puVar19;
    *(undefined8 *)(puVar36 + -0x1000) = 0;
    puVar19 = puVar36 + -0x1000;
  } while (puVar36 + -0x1000 != aBuf + 8);
  *(undefined8 *)(puVar36 + 0x1eff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pvVar5 = pPacket->m_pData;
  iVar22 = pPacket->m_DataSize;
  *(undefined8 *)(puVar36 + -0x1160) = 0x1204c3;
  CUnpacker::Reset((CUnpacker *)(puVar36 + -0x1128),pvVar5,iVar22);
  *(undefined8 *)(puVar36 + -0x1160) = 0x1204cb;
  uVar20 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
  if (*(int *)(puVar36 + -0x1110) != 0) goto LAB_001204d2;
  uVar37 = (int)uVar20 >> 1;
  uVar21 = pPacket->m_Flags;
  if ((uVar20 & 1) == 0) {
    if ((uVar21 & 1) != 0) {
      pIVar6 = this->m_pGameClient;
      p_Var7 = (pIVar6->super_IInterface)._vptr_IInterface[0xd];
      *(undefined8 *)(puVar36 + -0x1160) = 0x12051d;
      (*p_Var7)(pIVar6,(ulong)uVar37,puVar36 + -0x1128);
      if ((this->m_RecordGameMessage == true) && ((this->m_DemoRecorder).m_File != (IOHANDLE)0x0)) {
        pvVar5 = pPacket->m_pData;
        iVar22 = pPacket->m_DataSize;
        *(undefined8 *)(puVar36 + -0x1160) = 0x120547;
        CDemoRecorder::RecordMessage(&this->m_DemoRecorder,pvVar5,iVar22);
      }
    }
    goto LAB_001204d2;
  }
  if (uVar37 == 2 && (uVar21 & 1) != 0) {
    pCVar1 = (CUnpacker *)(puVar36 + -0x1128);
    *(undefined8 *)(puVar36 + -0x1160) = 0x120571;
    pcVar25 = CUnpacker::GetString(pCVar1,6);
    *(undefined8 *)(puVar36 + -0x1160) = 0x12057c;
    uVar20 = CUnpacker::GetInt(pCVar1);
    *(undefined8 *)(puVar36 + -0x1160) = 0x120586;
    uVar21 = CUnpacker::GetInt(pCVar1);
    *(undefined8 *)(puVar36 + -0x1160) = 0x120591;
    iVar22 = CUnpacker::GetInt(pCVar1);
    *(undefined8 *)(puVar36 + -0x1160) = 0x12059c;
    iVar23 = CUnpacker::GetInt(pCVar1);
    if (*(int *)(puVar36 + -0x1110) == 0) {
      *(int *)(puVar36 + -0x1140) = iVar23;
      *(undefined8 *)(puVar36 + -0x1160) = 0x1205ba;
      pSVar26 = (SHA256_DIGEST *)CUnpacker::GetRaw((CUnpacker *)(puVar36 + -0x1128),0x20);
      pIVar8 = this->m_pMapChecker;
      p_Var7 = (pIVar8->super_IInterface)._vptr_IInterface[3];
      *(undefined8 *)(puVar36 + -0x1160) = 0x1205d5;
      iVar23 = (*p_Var7)(pIVar8,pcVar25,pSVar26,(ulong)uVar20,(ulong)uVar21);
      pcVar38 = (char *)0x0;
      pcVar28 = pcVar25;
      if ((char)iVar23 == '\0') {
        pcVar38 = "invalid standard map";
      }
      do {
        cVar4 = *pcVar28;
        if ((cVar4 == '/') || (cVar4 == '\\')) {
          pcVar38 = "strange character in map name";
        }
        else if (cVar4 == '\0') goto LAB_00120807;
        pcVar28 = pcVar28 + 1;
      } while( true );
    }
    goto LAB_001204d2;
  }
  if (uVar37 != 3 || (uVar21 & 1) == 0) {
    if (uVar37 == 4 && (uVar21 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x120788;
      memset((CServerInfo *)(puVar36 + 0xeff8),0,0x228c);
      this_00 = (CClient *)&pPacket->m_Address;
      *(undefined8 *)(puVar36 + -0x1160) = 0x1207a6;
      net_addr_str((NETADDR *)this_00,puVar36 + 0xf154,0x30,1);
      *(undefined8 *)(puVar36 + -0x1160) = 0x1207b8;
      iVar22 = UnpackServerInfo(this_00,(CUnpacker *)(puVar36 + -0x1128),
                                (CServerInfo *)(puVar36 + 0xeff8),(int *)0x0);
      if (iVar22 == 0 && *(int *)(puVar36 + -0x1110) == 0) {
        *(undefined8 *)(puVar36 + -0x1160) = 0x1207d2;
        SortClients((CServerInfo *)(puVar36 + 0xeff8));
        *(undefined8 *)(puVar36 + -0x1160) = 0x1207e6;
        mem_copy(&this->m_CurrentServerInfo,(CServerInfo *)(puVar36 + 0xeff8),0x228c);
        *(undefined8 *)((this->m_CurrentServerInfo).m_NetAddr.ip + 0xc) =
             *(undefined8 *)((this->m_ServerAddress).ip + 0xc);
        uVar15 = (this->m_ServerAddress).ip[0];
        uVar16 = (this->m_ServerAddress).ip[1];
        uVar17 = (this->m_ServerAddress).ip[2];
        uVar18 = (this->m_ServerAddress).ip[3];
        uVar39 = *(undefined8 *)((this->m_ServerAddress).ip + 4);
        (this->m_CurrentServerInfo).m_NetAddr.type = (this->m_ServerAddress).type;
        (this->m_CurrentServerInfo).m_NetAddr.ip[0] = uVar15;
        (this->m_CurrentServerInfo).m_NetAddr.ip[1] = uVar16;
        (this->m_CurrentServerInfo).m_NetAddr.ip[2] = uVar17;
        (this->m_CurrentServerInfo).m_NetAddr.ip[3] = uVar18;
        *(undefined8 *)((this->m_CurrentServerInfo).m_NetAddr.ip + 4) = uVar39;
      }
      goto LAB_001204d2;
    }
    if (uVar37 == 5 && (uVar21 & 1) != 0) {
      p_Var7 = (this->m_pGameClient->super_IInterface)._vptr_IInterface[0xc];
      *(undefined8 *)(puVar36 + -0x1160) = 0x120847;
      (*p_Var7)();
      goto LAB_001204d2;
    }
    if (uVar37 == 0x1a) {
      pCVar2 = (CPacker *)(puVar36 + 0xeff8);
      *(undefined8 *)(puVar36 + -0x1160) = 0x120a28;
      CPacker::Reset(pCVar2);
      *(undefined8 *)(puVar36 + -0x1160) = 0x120a35;
      CPacker::AddInt(pCVar2,0x37);
      p_Var7 = (this->super_IClient).super_IInterface._vptr_IInterface[0x24];
      *(undefined8 *)(puVar36 + -0x1160) = 0x120a46;
      (*p_Var7)(this,pCVar2,0);
      goto LAB_001204d2;
    }
    if (uVar37 == 0xe && (uVar21 & 1) != 0) {
      pCVar1 = (CUnpacker *)(puVar36 + -0x1128);
      *(undefined8 *)(puVar36 + -0x1160) = 0x120aa6;
      pcVar25 = CUnpacker::GetString(pCVar1,2);
      *(undefined8 *)(puVar36 + -0x1160) = 0x120ab6;
      pcVar28 = CUnpacker::GetString(pCVar1,2);
      *(undefined8 *)(puVar36 + -0x1160) = 0x120ac6;
      pcVar38 = CUnpacker::GetString(pCVar1,2);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar40 = this->m_pConsole;
        p_Var7 = (pIVar40->super_IInterface)._vptr_IInterface[9];
        *(undefined8 *)(puVar36 + -0x1160) = 0x120aee;
        (*p_Var7)(pIVar40,pcVar25,pcVar38,4,pcVar28);
      }
      goto LAB_001204d2;
    }
    if (uVar37 == 0xf && (uVar21 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x120b88;
      pcVar25 = CUnpacker::GetString((CUnpacker *)(puVar36 + -0x1128),2);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar40 = this->m_pConsole;
        p_Var7 = (pIVar40->super_IInterface)._vptr_IInterface[10];
        *(undefined8 *)(puVar36 + -0x1160) = 0x120ba3;
        (*p_Var7)(pIVar40,pcVar25);
      }
      goto LAB_001204d2;
    }
    if (uVar37 == 0x1d && (uVar21 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x120bcc;
      pcVar25 = CUnpacker::GetString((CUnpacker *)(puVar36 + -0x1128),2);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar40 = this->m_pConsole;
        p_Var7 = (pIVar40->super_IInterface)._vptr_IInterface[0xc];
        *(undefined8 *)(puVar36 + -0x1160) = 0x120be7;
        (*p_Var7)(pIVar40,pcVar25);
      }
      goto LAB_001204d2;
    }
    if (uVar37 == 0x1e && (uVar21 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x120c10;
      pcVar25 = CUnpacker::GetString((CUnpacker *)(puVar36 + -0x1128),2);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar40 = this->m_pConsole;
        p_Var7 = (pIVar40->super_IInterface)._vptr_IInterface[0xd];
        *(undefined8 *)(puVar36 + -0x1160) = 0x120c2b;
        (*p_Var7)(pIVar40,pcVar25);
      }
      goto LAB_001204d2;
    }
    if (uVar37 == 0xb && (uVar21 & 1) != 0) {
      this->m_RconAuthed = 1;
      this->m_UseTempRconCommands = 1;
      goto LAB_001204d2;
    }
    if (uVar37 == 0xc && (uVar21 & 1) != 0) {
      this->m_RconAuthed = 0;
      if (this->m_UseTempRconCommands != 0) {
        p_Var7 = (this->m_pConsole->super_IInterface)._vptr_IInterface[0xb];
        *(undefined8 *)(puVar36 + -0x1160) = 0x120c8a;
        (*p_Var7)();
      }
      this->m_UseTempRconCommands = 0;
      p_Var7 = (this->m_pConsole->super_IInterface)._vptr_IInterface[0xe];
      *(undefined8 *)(puVar36 + -0x1160) = 0x120ca1;
      (*p_Var7)();
      goto LAB_001204d2;
    }
    if (uVar37 == 0xd && (uVar21 & 1) != 0) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x120cc8;
      pcVar25 = CUnpacker::GetString((CUnpacker *)(puVar36 + -0x1128),1);
      if (*(int *)(puVar36 + -0x1110) == 0) {
        pIVar6 = this->m_pGameClient;
        p_Var7 = (pIVar6->super_IInterface)._vptr_IInterface[3];
        *(undefined8 *)(puVar36 + -0x1160) = 0x120ce0;
        (*p_Var7)(pIVar6,pcVar25);
      }
      goto LAB_001204d2;
    }
    if (uVar37 == 10) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x120d75;
      iVar22 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
      *(undefined8 *)(puVar36 + -0x1160) = 0x120d80;
      iVar23 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
      lVar32 = 0;
      do {
        if (*(int *)((long)&this->m_aInputs[0].m_Tick + lVar32) == iVar22) {
          lVar11 = *(long *)((long)&this->m_aInputs[0].m_PredictedTime + lVar32);
          *(undefined8 *)(puVar36 + -0x1160) = 0x120e48;
          iVar31 = time_get();
          lVar32 = *(long *)((long)&this->m_aInputs[0].m_Time + lVar32);
          *(float *)(puVar36 + -0x1140) = (float)(iVar23 + -10) / 1000.0;
          *(undefined8 *)(puVar36 + -0x1160) = 0x120e6f;
          iVar33 = time_freq();
          lVar32 = (iVar31 + lVar11) -
                   ((long)((float)iVar33 * *(float *)(puVar36 + -0x1140)) + lVar32);
          if (lVar32 != 0) {
            *(undefined8 *)(puVar36 + -0x1160) = 0x120eb2;
            CSmoothTime::Update(&this->m_PredictedTime,&this->m_InputtimeMarginGraph,lVar32,iVar23,1
                               );
          }
          break;
        }
        lVar32 = lVar32 + 0x218;
      } while (lVar32 != 0x1a2c0);
      goto LAB_001204d2;
    }
    if (uVar37 == 0x1b) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x120cf8;
      iVar31 = time_get();
      *(float *)(puVar36 + -0x1140) = (float)((iVar31 - this->m_PingStartTime) * 1000);
      *(undefined8 *)(puVar36 + -0x1160) = 0x120d16;
      iVar31 = time_freq();
      pcVar25 = puVar36 + 0xeff8;
      *(undefined8 *)(puVar36 + -0x1160) = 0x120d4d;
      str_format(pcVar25,0x100,"latency %.2f",
                 (double)(*(float *)(puVar36 + -0x1140) / (float)iVar31));
      pIVar40 = this->m_pConsole;
      pp_Var30 = (pIVar40->super_IInterface)._vptr_IInterface;
      pcVar28 = "client/network";
      uVar39 = 0;
    }
    else {
      if ((uVar20 & 0xfffffffc) != 0xc && uVar37 != 8) goto LAB_001204d2;
      *(undefined8 *)(puVar36 + -0x1160) = 0x120dcc;
      iVar22 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
      *(ulong *)(puVar36 + -0x1140) = CONCAT44(extraout_var_00,iVar22);
      *(undefined8 *)(puVar36 + -0x1160) = 0x120dd9;
      iVar22 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
      if ((this->super_IClient).m_State < 2) goto LAB_001204d2;
      uVar21 = 0;
      uVar20 = 1;
      if (uVar37 == 7) {
        bVar14 = true;
        uVar37 = 0;
        *(undefined4 *)(puVar36 + -0x1134) = 0;
      }
      else {
        if (uVar37 == 6) {
          *(undefined8 *)(puVar36 + -0x1160) = 0x120e0a;
          uVar20 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
          *(undefined8 *)(puVar36 + -0x1160) = 0x120e15;
          uVar21 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
        }
        *(undefined8 *)(puVar36 + -0x1160) = 0x120e25;
        iVar23 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
        *(int *)(puVar36 + -0x1134) = iVar23;
        *(undefined8 *)(puVar36 + -0x1160) = 0x120e31;
        uVar37 = CUnpacker::GetInt((CUnpacker *)(puVar36 + -0x1128));
        bVar14 = false;
      }
      *(undefined8 *)(puVar36 + -0x1160) = 0x120ed2;
      puVar27 = CUnpacker::GetRaw((CUnpacker *)(puVar36 + -0x1128),uVar37);
      if (((((int)uVar21 < 0) || (uVar20 - 0x41 < 0xffffffc0)) || (*(int *)(puVar36 + -0x1110) != 0)
          ) || (900 < uVar37 || uVar20 <= uVar21)) goto LAB_001204d2;
      iVar23 = (int)*(undefined8 *)(puVar36 + -0x1140);
      iVar22 = iVar23 - iVar22;
      if (iVar23 < this->m_CurrentRecvTick) goto LAB_001204d2;
      if (iVar23 != this->m_CurrentRecvTick) {
        this->m_SnapshotParts = 0;
        this->m_CurrentRecvTick = (int)*(undefined8 *)(puVar36 + -0x1140);
      }
      *(undefined8 *)(puVar36 + -0x1160) = 0x120f59;
      mem_copy(this->m_aSnapshotIncomingData + uVar21 * 900,puVar27,uVar37);
      uVar21 = this->m_SnapshotParts | 1 << (uVar21 & 0x1f);
      this->m_SnapshotParts = uVar21;
      if ((-1 << ((byte)uVar20 & 0x1f) ^ uVar21) != 0xffffffff) goto LAB_001204d2;
      *(CSnapshot **)(puVar36 + -0x1130) = &ProcessServerPacket::Emptysnap;
      this->m_SnapshotParts = 0;
      ProcessServerPacket::Emptysnap.m_DataSize = 0;
      ProcessServerPacket::Emptysnap.m_NumItems = 0;
      if (-1 < iVar22) {
        *(undefined8 *)(puVar36 + -0x1160) = 0x120fbd;
        iVar23 = CSnapshotStorage::Get
                           (&this->m_SnapshotStorage,iVar22,(int64 *)0x0,
                            (CSnapshot **)(puVar36 + -0x1130),(CSnapshot **)0x0);
        if (iVar23 < 0) {
          if (this->m_pConfig->m_Debug != 0) {
            *(undefined8 *)(puVar36 + -0x1160) = 0x1212db;
            str_format(puVar36 + -0x1108,0x100,"error, couldn\'t find the delta snapshot");
            pIVar40 = this->m_pConsole;
            p_Var7 = (pIVar40->super_IInterface)._vptr_IInterface[0x19];
            *(undefined8 *)(puVar36 + -0x1160) = 0x1212fd;
            (*p_Var7)(pIVar40,2,"client",puVar36 + -0x1108,0);
          }
          this->m_AckGameTick = -1;
          goto LAB_001204d2;
        }
      }
      iVar23 = uVar20 * 900 + uVar37 + -900;
      *(undefined8 *)(puVar36 + -0x1160) = 0x120fe6;
      pDst_ = CSnapshotDelta::EmptyDelta(&this->m_SnapshotDelta);
      if (iVar23 == 0) {
        iVar24 = 0xc;
      }
      else {
        pDst_ = (CData *)(puVar36 + 0xeff8);
        *(undefined8 *)(puVar36 + -0x1160) = 0x12100a;
        lVar32 = CVariableInt::Decompress(this->m_aSnapshotIncomingData,iVar23,pDst_,0x10000);
        iVar24 = (int)lVar32;
        if (iVar24 < 0) goto LAB_001204d2;
      }
      *(undefined8 *)(puVar36 + -0x1160) = 0x12103d;
      uVar20 = CSnapshotDelta::UnpackDelta
                         (&this->m_SnapshotDelta,*(CSnapshot **)(puVar36 + -0x1130),
                          (CSnapshot *)(puVar36 + -0x1008),pDst_,iVar24);
      if (-1 < (int)uVar20) {
        if (!bVar14) {
          *(undefined8 *)(puVar36 + -0x1160) = 0x12105a;
          iVar24 = CSnapshot::Crc((CSnapshot *)(puVar36 + -0x1008));
          if (iVar24 != *(int *)(puVar36 + -0x1134)) {
            if (this->m_pConfig->m_Debug != 0) {
              uVar20 = this->m_SnapCrcErrors;
              *(undefined8 *)(puVar36 + -0x1160) = 0x12136b;
              iVar24 = CSnapshot::Crc((CSnapshot *)(puVar36 + -0x1008));
              *(int *)(puVar36 + -0x1148) = iVar22;
              *(int *)(puVar36 + -0x1150) = iVar23;
              *(int *)(puVar36 + -0x1158) = iVar24;
              *(undefined8 *)(puVar36 + -0x1160) = 0x12139f;
              str_format(puVar36 + -0x1108,0x100,
                         "snapshot crc error #%d - tick=%d wantedcrc=%d gotcrc=%d compressed_size=%d delta_tick=%d"
                         ,(ulong)uVar20,*(undefined8 *)(puVar36 + -0x1140),
                         (ulong)*(uint *)(puVar36 + -0x1134));
              pIVar40 = this->m_pConsole;
              p_Var7 = (pIVar40->super_IInterface)._vptr_IInterface[0x19];
              *(undefined8 *)(puVar36 + -0x1160) = 0x1213c1;
              (*p_Var7)(pIVar40,2,"client",puVar36 + -0x1108,0);
            }
            iVar22 = this->m_SnapCrcErrors;
            this->m_SnapCrcErrors = iVar22 + 1;
            if (9 < iVar22) {
              this->m_AckGameTick = -1;
              *(undefined8 *)(puVar36 + -0x1160) = 0x1213eb;
              SendInput(this);
              this->m_SnapCrcErrors = 0;
            }
            goto LAB_001204d2;
          }
        }
        if (this->m_SnapCrcErrors != 0) {
          this->m_SnapCrcErrors = this->m_SnapCrcErrors + -1;
        }
        if ((this->m_aSnapshots[1] != (CHolder *)0x0) &&
           (iVar23 = this->m_aSnapshots[1]->m_Tick, iVar23 < iVar22)) {
          iVar22 = iVar23;
        }
        if ((this->m_aSnapshots[0] != (CHolder *)0x0) &&
           (iVar23 = this->m_aSnapshots[0]->m_Tick, iVar23 < iVar22)) {
          iVar22 = iVar23;
        }
        *(undefined8 *)(puVar36 + -0x1160) = 0x1210b4;
        CSnapshotStorage::PurgeUntil(&this->m_SnapshotStorage,iVar22);
        *(undefined8 *)(puVar36 + -0x1160) = 0x1210b9;
        iVar31 = time_get();
        *(undefined8 *)(puVar36 + -0x1160) = 0x1210da;
        CSnapshotStorage::Add
                  (&this->m_SnapshotStorage,(int)*(undefined8 *)(puVar36 + -0x1140),iVar31,uVar20,
                   puVar36 + -0x1008,true);
        if ((this->m_DemoRecorder).m_File != (IOHANDLE)0x0) {
          pSnapshot = (CSnapshot *)(puVar36 + -0x1008);
          *(undefined8 *)(puVar36 + -0x1160) = 0x121105;
          CSnapshotBuilder::Init(&this->m_DemoRecSnapshotBuilder,pSnapshot);
          p_Var7 = (this->m_pGameClient->super_IInterface)._vptr_IInterface[6];
          *(undefined8 *)(puVar36 + -0x1160) = 0x12110f;
          (*p_Var7)();
          *(undefined8 *)(puVar36 + -0x1160) = 0x12111a;
          iVar22 = CSnapshotBuilder::Finish(&this->m_DemoRecSnapshotBuilder,pSnapshot);
          *(undefined8 *)(puVar36 + -0x1160) = 0x12112c;
          CDemoRecorder::RecordSnapshot
                    (&this->m_DemoRecorder,(int)*(undefined8 *)(puVar36 + -0x1140),pSnapshot,iVar22)
          ;
        }
        iVar22 = this->m_ReceivedSnapshots + 1;
        this->m_ReceivedSnapshots = iVar22;
        iVar23 = (int)*(undefined8 *)(puVar36 + -0x1140);
        this->m_CurrentRecvTick = iVar23;
        if (iVar22 == 2) {
          *(undefined8 *)(puVar36 + -0x1160) = 0x121167;
          iVar31 = time_freq();
          *(undefined8 *)(puVar36 + -0x1160) = 0x12118d;
          CSmoothTime::Init(&this->m_PredictedTime,(iVar31 * iVar23) / 0x32);
          (this->m_PredictedTime).m_aAdjustSpeed[1] = 1000.0;
          uVar39 = *(undefined8 *)(puVar36 + -0x1140);
          *(undefined8 *)(puVar36 + -0x1160) = 0x1211ad;
          iVar31 = time_freq();
          *(undefined8 *)(puVar36 + -0x1160) = 0x1211d3;
          CSmoothTime::Init(&this->m_GameTime,(((int)uVar39 + -1) * iVar31) / 0x32);
          CVar3 = this->m_SnapshotStorage;
          auVar41._0_8_ = CVar3.m_pLast;
          auVar41._8_4_ = (int)CVar3.m_pFirst;
          auVar41._12_4_ = CVar3.m_pFirst._4_4_;
          *(undefined1 (*) [16])this->m_aSnapshots = auVar41;
          *(undefined8 *)(puVar36 + -0x1160) = 0x1211f5;
          SetState(this,3);
          iVar22 = this->m_ReceivedSnapshots;
        }
        if (2 < iVar22) {
          *(undefined8 *)(puVar36 + -0x1160) = 0x121210;
          iVar31 = time_get();
          *(undefined8 *)(puVar36 + -0x1160) = 0x12121b;
          iVar31 = CSmoothTime::Get(&this->m_GameTime,iVar31);
          *(undefined8 *)(puVar36 + -0x1160) = 0x121223;
          iVar33 = time_freq();
          *(undefined8 *)(puVar36 + -0x1160) = 0x121250;
          iVar34 = time_freq();
          uVar39 = *(undefined8 *)(puVar36 + -0x1140);
          *(undefined8 *)(puVar36 + -0x1160) = 0x121274;
          iVar35 = time_freq();
          *(undefined8 *)(puVar36 + -0x1160) = 0x1212a0;
          CSmoothTime::Update(&this->m_GameTime,&this->m_GametimeMarginGraph,
                              (((int)uVar39 + -1) * iVar35) / 0x32,
                              (int)((((iVar33 * iVar23) / 0x32 - iVar31) * 1000) / iVar34),0);
        }
        this->m_AckGameTick = (int)*(undefined8 *)(puVar36 + -0x1140);
        goto LAB_001204d2;
      }
      pcVar25 = puVar36 + -0x1108;
      *(undefined8 *)(puVar36 + -0x1160) = 0x12132a;
      str_format(pcVar25,0x40,"delta unpack failed! (%d)",(ulong)uVar20);
      pIVar40 = this->m_pConsole;
      pp_Var30 = (pIVar40->super_IInterface)._vptr_IInterface;
      pcVar28 = "client";
      uVar39 = 2;
    }
    goto LAB_00120a05;
  }
  if (this->m_MapdownloadFileTemp == (IOHANDLE)0x0) goto LAB_001204d2;
  uVar20 = this->m_MapdownloadTotalsize - this->m_MapdownloadAmount;
  if (this->m_MapDownloadChunkSize < (int)uVar20) {
    uVar20 = this->m_MapDownloadChunkSize;
  }
  *(undefined8 *)(puVar36 + -0x1160) = 0x120656;
  puVar27 = CUnpacker::GetRaw((CUnpacker *)(puVar36 + -0x1128),uVar20);
  if (*(int *)(puVar36 + -0x1110) != 0) goto LAB_001204d2;
  pIVar9 = this->m_MapdownloadFileTemp;
  *(undefined8 *)(puVar36 + -0x1160) = 0x120672;
  io_write(pIVar9,puVar27,uVar20);
  iVar22 = this->m_MapdownloadChunk + 1;
  this->m_MapdownloadChunk = iVar22;
  iVar23 = uVar20 + this->m_MapdownloadAmount;
  this->m_MapdownloadAmount = iVar23;
  if (iVar23 != this->m_MapdownloadTotalsize) {
    if (iVar22 % this->m_MapdownloadChunkNum != 0) goto LAB_001204d2;
    pCVar2 = (CPacker *)(puVar36 + 0xeff8);
    *(undefined8 *)(puVar36 + -0x1160) = 0x120b12;
    CPacker::Reset(pCVar2);
    *(undefined8 *)(puVar36 + -0x1160) = 0x120b1f;
    CPacker::AddInt(pCVar2,0x2f);
    p_Var7 = (this->super_IClient).super_IInterface._vptr_IInterface[0x24];
    *(undefined8 *)(puVar36 + -0x1160) = 0x120b33;
    (*p_Var7)(this,pCVar2,3);
    if (this->m_pConfig->m_Debug == 0) goto LAB_001204d2;
    pIVar40 = this->m_pConsole;
    pp_Var30 = (pIVar40->super_IInterface)._vptr_IInterface;
    pcVar25 = "requested next chunk package";
    goto LAB_00120a00;
  }
  pIVar40 = this->m_pConsole;
  p_Var7 = (pIVar40->super_IInterface)._vptr_IInterface[0x19];
  *(undefined8 *)(puVar36 + -0x1160) = 0x1206be;
  (*p_Var7)(pIVar40,1,"client/network","download complete, loading map",0);
  pIVar9 = this->m_MapdownloadFileTemp;
  if (pIVar9 != (IOHANDLE)0x0) {
    *(undefined8 *)(puVar36 + -0x1160) = 0x1206cf;
    io_close(pIVar9);
  }
  this->m_MapdownloadFileTemp = (IOHANDLE)0x0;
  this->m_MapdownloadAmount = 0;
  this->m_MapdownloadTotalsize = -1;
  pIVar10 = this->m_pStorage;
  pcVar25 = this->m_aMapdownloadFilename;
  p_Var7 = (pIVar10->super_IInterface)._vptr_IInterface[9];
  *(undefined8 *)(puVar36 + -0x1160) = 0x120703;
  (*p_Var7)(pIVar10,pcVar25,0);
  pIVar10 = this->m_pStorage;
  p_Var7 = (pIVar10->super_IInterface)._vptr_IInterface[10];
  *(undefined8 *)(puVar36 + -0x1160) = 0x12071c;
  (*p_Var7)(pIVar10,this->m_aMapdownloadFilenameTemp,pcVar25,0);
  pSVar26 = &this->m_MapdownloadSha256;
  if (this->m_MapdownloadSha256Present == false) {
    pSVar26 = (SHA256_DIGEST *)0x0;
  }
  uVar20 = this->m_MapdownloadCrc;
  *(undefined8 *)(puVar36 + -0x1160) = 0x120747;
  pcVar38 = LoadMap(this,this->m_aMapdownloadName,pcVar25,pSVar26,uVar20);
  if (pcVar38 == (char *)0x0) goto LAB_00120a4b;
LAB_0012081d:
  *(undefined8 *)(puVar36 + -0x1160) = 0x120822;
  DisconnectWithReason(this,pcVar38);
LAB_001204d2:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(puVar36 + 0x1eff8)) {
    *(undefined8 *)(puVar36 + -0x1160) = 0x12101c;
    __stack_chk_fail();
  }
  return;
LAB_00120807:
  if ((int)uVar21 < 1) {
    pcVar38 = "invalid map size";
  }
  if (pcVar38 == (char *)0x0) {
    *(undefined8 *)(puVar36 + -0x1160) = 0x12085c;
    pcVar28 = LoadMapSearch(this,pcVar25,pSVar26,uVar20);
    if (pcVar28 == (char *)0x0) {
LAB_00120a4b:
      pIVar40 = this->m_pConsole;
      p_Var7 = (pIVar40->super_IInterface)._vptr_IInterface[0x19];
      *(undefined8 *)(puVar36 + -0x1160) = 0x120a71;
      (*p_Var7)(pIVar40,1,"client/network","loading done",0);
      *(undefined8 *)(puVar36 + -0x1160) = 0x120a79;
      SendReady(this);
      goto LAB_001204d2;
    }
    *(int *)(puVar36 + -0x1134) = iVar22;
    pIVar9 = this->m_MapdownloadFileTemp;
    if (pIVar9 != (IOHANDLE)0x0) {
      *(undefined8 *)(puVar36 + -0x1160) = 0x12087b;
      io_close(pIVar9);
      pIVar10 = this->m_pStorage;
      p_Var7 = (pIVar10->super_IInterface)._vptr_IInterface[9];
      *(undefined8 *)(puVar36 + -0x1160) = 0x120891;
      (*p_Var7)(pIVar10,this->m_aMapdownloadFilenameTemp,0);
    }
    *(undefined8 *)(puVar36 + -0x1160) = 0x1208a7;
    FormatMapDownloadFilename(pcVar25,pSVar26,uVar20,false,this->m_aMapdownloadFilename,in_R9D);
    pcVar28 = this->m_aMapdownloadFilenameTemp;
    *(undefined8 *)(puVar36 + -0x1160) = 0x1208c3;
    FormatMapDownloadFilename(pcVar25,pSVar26,uVar20,true,pcVar28,in_R9D);
    *(undefined8 *)(puVar36 + -0x1160) = 0x1208e1;
    str_format(puVar36 + -0x1008,0x100,"starting to download map to \'%s\'",pcVar28);
    pIVar40 = this->m_pConsole;
    p_Var7 = (pIVar40->super_IInterface)._vptr_IInterface[0x19];
    *(undefined8 *)(puVar36 + -0x1160) = 0x120908;
    (*p_Var7)(pIVar40,1,"client/network",puVar36 + -0x1008,0);
    *(undefined8 *)(puVar36 + -0x1160) = 0x12091c;
    str_copy(this->m_aMapdownloadName,pcVar25,0x200);
    pIVar10 = this->m_pStorage;
    pp_Var30 = (pIVar10->super_IInterface)._vptr_IInterface;
    *(undefined8 *)(puVar36 + -0x1158) = 0;
    *(undefined8 *)(puVar36 + -0x1150) = 0;
    p_Var7 = pp_Var30[4];
    *(undefined8 *)(puVar36 + -0x1160) = 0x120940;
    iVar22 = (*p_Var7)(pIVar10,pcVar28,2,0,0,0);
    this->m_MapdownloadFileTemp = (IOHANDLE)CONCAT44(extraout_var,iVar22);
    this->m_MapdownloadChunk = 0;
    this->m_MapdownloadChunkNum = *(int *)(puVar36 + -0x1134);
    pSVar29 = &SHA256_ZEROED;
    if (pSVar26 != (SHA256_DIGEST *)0x0) {
      pSVar29 = pSVar26;
    }
    this->m_MapDownloadChunkSize = *(int *)(puVar36 + -0x1140);
    uVar39 = *(undefined8 *)(pSVar29->data + 8);
    uVar12 = *(undefined8 *)(pSVar29->data + 0x10);
    uVar13 = *(undefined8 *)(pSVar29->data + 0x18);
    *(undefined8 *)(this->m_MapdownloadSha256).data = *(undefined8 *)pSVar29->data;
    *(undefined8 *)((this->m_MapdownloadSha256).data + 8) = uVar39;
    *(undefined8 *)((this->m_MapdownloadSha256).data + 0x10) = uVar12;
    *(undefined8 *)((this->m_MapdownloadSha256).data + 0x18) = uVar13;
    this->m_MapdownloadSha256Present = pSVar26 != (SHA256_DIGEST *)0x0;
    this->m_MapdownloadCrc = uVar20;
    this->m_MapdownloadTotalsize = uVar21;
    this->m_MapdownloadAmount = 0;
    pCVar2 = (CPacker *)(puVar36 + 0xeff8);
    *(undefined8 *)(puVar36 + -0x1160) = 0x1209b3;
    CPacker::Reset(pCVar2);
    *(undefined8 *)(puVar36 + -0x1160) = 0x1209c0;
    CPacker::AddInt(pCVar2,0x2f);
    p_Var7 = (this->super_IClient).super_IInterface._vptr_IInterface[0x24];
    *(undefined8 *)(puVar36 + -0x1160) = 0x1209d4;
    (*p_Var7)(this,pCVar2,3);
    if (this->m_pConfig->m_Debug == 0) goto LAB_001204d2;
    pIVar40 = this->m_pConsole;
    pp_Var30 = (pIVar40->super_IInterface)._vptr_IInterface;
    pcVar25 = "requested first chunk package";
LAB_00120a00:
    pcVar28 = "client/network";
    uVar39 = 2;
LAB_00120a05:
    p_Var7 = pp_Var30[0x19];
    *(undefined8 *)(puVar36 + -0x1160) = 0x120a0e;
    (*p_Var7)(pIVar40,uVar39,pcVar28,pcVar25,0);
    goto LAB_001204d2;
  }
  goto LAB_0012081d;
}

Assistant:

void CClient::ProcessServerPacket(CNetChunk *pPacket)
{
	CUnpacker Unpacker;
	Unpacker.Reset(pPacket->m_pData, pPacket->m_DataSize);

	// unpack msgid and system flag
	int Msg = Unpacker.GetInt();
	int Sys = Msg&1;
	Msg >>= 1;

	if(Unpacker.Error())
		return;

	if(Sys)
	{
		// system message
		if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAP_CHANGE)
		{
			const char *pMap = Unpacker.GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
			int MapCrc = Unpacker.GetInt();
			int MapSize = Unpacker.GetInt();
			int MapChunkNum = Unpacker.GetInt();
			int MapChunkSize = Unpacker.GetInt();
			if(Unpacker.Error())
				return;
			const SHA256_DIGEST *pMapSha256 = (const SHA256_DIGEST *)Unpacker.GetRaw(sizeof(*pMapSha256));
			const char *pError = 0;

			// check for valid standard map
			if(!m_pMapChecker->IsMapValid(pMap, pMapSha256, MapCrc, MapSize))
				pError = "invalid standard map";

			// protect the player from nasty map names
			for(int i = 0; pMap[i]; i++)
			{
				if(pMap[i] == '/' || pMap[i] == '\\')
					pError = "strange character in map name";
			}

			if(MapSize <= 0)
				pError = "invalid map size";

			if(pError)
				DisconnectWithReason(pError);
			else
			{
				pError = LoadMapSearch(pMap, pMapSha256, MapCrc);

				if(!pError)
				{
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "loading done");
					SendReady();
				}
				else
				{
					if(m_MapdownloadFileTemp)
					{
						io_close(m_MapdownloadFileTemp);
						Storage()->RemoveFile(m_aMapdownloadFilenameTemp, IStorage::TYPE_SAVE);
					}

					// start map download
					FormatMapDownloadFilename(pMap, pMapSha256, MapCrc, false, m_aMapdownloadFilename, sizeof(m_aMapdownloadFilename));
					FormatMapDownloadFilename(pMap, pMapSha256, MapCrc, true, m_aMapdownloadFilenameTemp, sizeof(m_aMapdownloadFilenameTemp));

					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "starting to download map to '%s'", m_aMapdownloadFilenameTemp);
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", aBuf);

					str_copy(m_aMapdownloadName, pMap, sizeof(m_aMapdownloadName));
					m_MapdownloadFileTemp = Storage()->OpenFile(m_aMapdownloadFilenameTemp, IOFLAG_WRITE, IStorage::TYPE_SAVE);
					m_MapdownloadChunk = 0;
					m_MapdownloadChunkNum = MapChunkNum;
					m_MapDownloadChunkSize = MapChunkSize;
					m_MapdownloadSha256 = pMapSha256 ? *pMapSha256 : SHA256_ZEROED;
					m_MapdownloadSha256Present = pMapSha256;
					m_MapdownloadCrc = MapCrc;
					m_MapdownloadTotalsize = MapSize;
					m_MapdownloadAmount = 0;

					// request first chunk package of map data
					CMsgPacker Msg(NETMSG_REQUEST_MAP_DATA, true);
					SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH);

					if(Config()->m_Debug)
						m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client/network", "requested first chunk package");
				}
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAP_DATA)
		{
			if(!m_MapdownloadFileTemp)
				return;

			int Size = minimum(m_MapDownloadChunkSize, m_MapdownloadTotalsize-m_MapdownloadAmount);
			const unsigned char *pData = Unpacker.GetRaw(Size);
			if(Unpacker.Error())
				return;

			io_write(m_MapdownloadFileTemp, pData, Size);
			++m_MapdownloadChunk;
			m_MapdownloadAmount += Size;

			if(m_MapdownloadAmount == m_MapdownloadTotalsize)
			{
				// map download complete
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "download complete, loading map");

				if(m_MapdownloadFileTemp)
					io_close(m_MapdownloadFileTemp);
				m_MapdownloadFileTemp = 0;
				m_MapdownloadAmount = 0;
				m_MapdownloadTotalsize = -1;

				Storage()->RemoveFile(m_aMapdownloadFilename, IStorage::TYPE_SAVE);
				Storage()->RenameFile(m_aMapdownloadFilenameTemp, m_aMapdownloadFilename, IStorage::TYPE_SAVE);

				// load map
				const char *pError = LoadMap(m_aMapdownloadName, m_aMapdownloadFilename, m_MapdownloadSha256Present ? &m_MapdownloadSha256 : 0, m_MapdownloadCrc);
				if(!pError)
				{
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "loading done");
					SendReady();
				}
				else
					DisconnectWithReason(pError);
			}
			else if(m_MapdownloadChunk%m_MapdownloadChunkNum == 0)
			{
				// request next chunk package of map data
				CMsgPacker Msg(NETMSG_REQUEST_MAP_DATA, true);
				SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH);

				if(Config()->m_Debug)
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client/network", "requested next chunk package");
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_SERVERINFO)
		{
			CServerInfo Info = {0};
			net_addr_str(&pPacket->m_Address, Info.m_aAddress, sizeof(Info.m_aAddress), true);
			if(!UnpackServerInfo(&Unpacker, &Info, 0) && !Unpacker.Error())
			{
				SortClients(&Info);
				mem_copy(&m_CurrentServerInfo, &Info, sizeof(m_CurrentServerInfo));
				m_CurrentServerInfo.m_NetAddr = m_ServerAddress;
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_CON_READY)
		{
			GameClient()->OnConnected();
		}
		else if(Msg == NETMSG_PING)
		{
			CMsgPacker Msg(NETMSG_PING_REPLY, true);
			SendMsg(&Msg, 0);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_CMD_ADD)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			const char *pHelp = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			const char *pParams = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->RegisterTemp(pName, pParams, CFGFLAG_SERVER, pHelp);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_CMD_REM)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->DeregisterTemp(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAPLIST_ENTRY_ADD)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->RegisterTempMap(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAPLIST_ENTRY_REM)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->DeregisterTempMap(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_AUTH_ON)
		{
			m_RconAuthed = 1;
			m_UseTempRconCommands = 1;
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_AUTH_OFF)
		{
			m_RconAuthed = 0;
			if(m_UseTempRconCommands)
				m_pConsole->DeregisterTempAll();
			m_UseTempRconCommands = 0;
			m_pConsole->DeregisterTempMapAll();
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_LINE)
		{
			const char *pLine = Unpacker.GetString();
			if(Unpacker.Error() == 0)
				GameClient()->OnRconLine(pLine);
		}
		else if(Msg == NETMSG_PING_REPLY)
		{
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "latency %.2f", (time_get() - m_PingStartTime)*1000 / (float)time_freq());
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client/network", aBuf);
		}
		else if(Msg == NETMSG_INPUTTIMING)
		{
			int InputPredTick = Unpacker.GetInt();
			int TimeLeft = Unpacker.GetInt();

			// adjust our prediction time
			int64 Target = 0;
			for(int k = 0; k < 200; k++)
			{
				if(m_aInputs[k].m_Tick == InputPredTick)
				{
					Target = m_aInputs[k].m_PredictedTime + (time_get() - m_aInputs[k].m_Time);
					Target = Target - (int64)(((TimeLeft-PREDICTION_MARGIN)/1000.0f)*time_freq());
					break;
				}
			}

			if(Target)
				m_PredictedTime.Update(&m_InputtimeMarginGraph, Target, TimeLeft, 1);
		}
		else if(Msg == NETMSG_SNAP || Msg == NETMSG_SNAPSINGLE || Msg == NETMSG_SNAPEMPTY)
		{
			int NumParts = 1;
			int Part = 0;
			int GameTick = Unpacker.GetInt();
			int DeltaTick = GameTick-Unpacker.GetInt();
			int PartSize = 0;
			int Crc = 0;
			int CompleteSize = 0;
			const char *pData = 0;

			// we are not allowed to process snapshot yet
			if(State() < IClient::STATE_LOADING)
				return;

			if(Msg == NETMSG_SNAP)
			{
				NumParts = Unpacker.GetInt();
				Part = Unpacker.GetInt();
			}

			if(Msg != NETMSG_SNAPEMPTY)
			{
				Crc = Unpacker.GetInt();
				PartSize = Unpacker.GetInt();
			}

			pData = (const char *)Unpacker.GetRaw(PartSize);

			if(Unpacker.Error() || NumParts < 1 || NumParts > CSnapshot::MAX_PARTS || Part < 0 || Part >= NumParts || PartSize < 0 || PartSize > MAX_SNAPSHOT_PACKSIZE)
				return;

			if(GameTick >= m_CurrentRecvTick)
			{
				if(GameTick != m_CurrentRecvTick)
				{
					m_SnapshotParts = 0;
					m_CurrentRecvTick = GameTick;
				}

				// TODO: clean this up abit
				mem_copy((char*)m_aSnapshotIncomingData + Part*MAX_SNAPSHOT_PACKSIZE, pData, PartSize);
				m_SnapshotParts |= 1<<Part;

				if(m_SnapshotParts == (unsigned)((1<<NumParts)-1))
				{
					static CSnapshot Emptysnap;
					CSnapshot *pDeltaShot = &Emptysnap;
					int PurgeTick;
					int DeltaSize;
					unsigned char aTmpBuffer2[CSnapshot::MAX_SIZE];
					unsigned char aTmpBuffer3[CSnapshot::MAX_SIZE];
					CSnapshot *pTmpBuffer3 = (CSnapshot*)aTmpBuffer3;	// Fix compiler warning for strict-aliasing
					int SnapSize;

					CompleteSize = (NumParts-1) * MAX_SNAPSHOT_PACKSIZE + PartSize;

					// reset snapshoting
					m_SnapshotParts = 0;

					// find snapshot that we should use as delta
					Emptysnap.Clear();

					// find delta
					if(DeltaTick >= 0)
					{
						int DeltashotSize = m_SnapshotStorage.Get(DeltaTick, 0, &pDeltaShot, 0);

						if(DeltashotSize < 0)
						{
							// couldn't find the delta snapshots that the server used
							// to compress this snapshot. force the server to resync
							if(Config()->m_Debug)
							{
								char aBuf[256];
								str_format(aBuf, sizeof(aBuf), "error, couldn't find the delta snapshot");
								m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
							}

							// ack snapshot
							// TODO: combine this with the input message
							m_AckGameTick = -1;
							return;
						}
					}

					// decompress snapshot
					const void *pDeltaData = m_SnapshotDelta.EmptyDelta();
					DeltaSize = sizeof(int)*3;

					if(CompleteSize)
					{
						int IntSize = CVariableInt::Decompress(m_aSnapshotIncomingData, CompleteSize, aTmpBuffer2, sizeof(aTmpBuffer2));

						if(IntSize < 0) // failure during decompression, bail
							return;

						pDeltaData = aTmpBuffer2;
						DeltaSize = IntSize;
					}

					// unpack delta
					SnapSize = m_SnapshotDelta.UnpackDelta(pDeltaShot, pTmpBuffer3, pDeltaData, DeltaSize);
					if(SnapSize < 0)
					{
						char aBuf[64];
						str_format(aBuf, sizeof(aBuf), "delta unpack failed! (%d)", SnapSize);
						m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
						return;
					}

					if(Msg != NETMSG_SNAPEMPTY && pTmpBuffer3->Crc() != Crc)
					{
						if(Config()->m_Debug)
						{
							char aBuf[256];
							str_format(aBuf, sizeof(aBuf), "snapshot crc error #%d - tick=%d wantedcrc=%d gotcrc=%d compressed_size=%d delta_tick=%d",
								m_SnapCrcErrors, GameTick, Crc, pTmpBuffer3->Crc(), CompleteSize, DeltaTick);
							m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
						}

						m_SnapCrcErrors++;
						if(m_SnapCrcErrors > 10)
						{
							// to many errors, send reset
							m_AckGameTick = -1;
							SendInput();
							m_SnapCrcErrors = 0;
						}
						return;
					}
					else
					{
						if(m_SnapCrcErrors)
							m_SnapCrcErrors--;
					}

					// purge old snapshots
					PurgeTick = DeltaTick;
					if(m_aSnapshots[SNAP_PREV] && m_aSnapshots[SNAP_PREV]->m_Tick < PurgeTick)
						PurgeTick = m_aSnapshots[SNAP_PREV]->m_Tick;
					if(m_aSnapshots[SNAP_CURRENT] && m_aSnapshots[SNAP_CURRENT]->m_Tick < PurgeTick)
						PurgeTick = m_aSnapshots[SNAP_CURRENT]->m_Tick;
					m_SnapshotStorage.PurgeUntil(PurgeTick);

					// add new
					m_SnapshotStorage.Add(GameTick, time_get(), SnapSize, pTmpBuffer3, 1);

					// add snapshot to demo
					if(m_DemoRecorder.IsRecording())
					{
						// build up snapshot and add local messages
						m_DemoRecSnapshotBuilder.Init(pTmpBuffer3);
						GameClient()->OnDemoRecSnap();
						SnapSize = m_DemoRecSnapshotBuilder.Finish(pTmpBuffer3);

						// write snapshot
						m_DemoRecorder.RecordSnapshot(GameTick, pTmpBuffer3, SnapSize);
					}

					// apply snapshot, cycle pointers
					m_ReceivedSnapshots++;

					m_CurrentRecvTick = GameTick;

					// we got two snapshots until we see us self as connected
					if(m_ReceivedSnapshots == 2)
					{
						// start at 200ms and work from there
						m_PredictedTime.Init(GameTick*time_freq()/50);
						m_PredictedTime.SetAdjustSpeed(1, 1000.0f);
						m_GameTime.Init((GameTick-1)*time_freq()/50);
						m_aSnapshots[SNAP_PREV] = m_SnapshotStorage.m_pFirst;
						m_aSnapshots[SNAP_CURRENT] = m_SnapshotStorage.m_pLast;
						SetState(IClient::STATE_ONLINE);
					}

					// adjust game time
					if(m_ReceivedSnapshots > 2)
					{
						int64 Now = m_GameTime.Get(time_get());
						int64 TickStart = GameTick*time_freq()/50;
						int64 TimeLeft = (TickStart-Now)*1000 / time_freq();
						m_GameTime.Update(&m_GametimeMarginGraph, (GameTick-1)*time_freq()/50, TimeLeft, 0);
					}

					// ack snapshot
					m_AckGameTick = GameTick;
				}
			}
		}
	}
	else
	{
		if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0)
		{
			// game message
			GameClient()->OnMessage(Msg, &Unpacker);

			if(m_RecordGameMessage && m_DemoRecorder.IsRecording())
				m_DemoRecorder.RecordMessage(pPacket->m_pData, pPacket->m_DataSize);
		}
	}
}